

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O1

SectionHdrWrapper * __thiscall PEFile::extendLastSection(PEFile *this,bufsize_t addedSize)

{
  int iVar1;
  SectionHdrWrapper *pSVar2;
  undefined4 extraout_var;
  offset_t oVar3;
  bufsize_t bVar4;
  ulong uVar5;
  uint64_t size;
  long lVar6;
  bool bVar7;
  WatchedLocker lock;
  WatchedLocker WStack_68;
  
  WatchedLocker::WatchedLocker(&WStack_68,&this->m_peMutex,false,"extendLastSection");
  pSVar2 = _getLastSection(this);
  if (pSVar2 == (SectionHdrWrapper *)0x0) {
    bVar7 = false;
    lVar6 = 0;
  }
  else {
    iVar1 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[2])(this);
    oVar3 = SectionHdrWrapper::getContentOffset(pSVar2,RAW,false);
    lVar6 = CONCAT44(extraout_var,iVar1) + addedSize;
    bVar7 = oVar3 != 0xffffffffffffffff;
    if (bVar7) {
      uVar5 = lVar6 - oVar3;
      (*(pSVar2->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
        super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1d])(pSVar2,3,0xffffffffffffffff,uVar5);
      oVar3 = SectionHdrWrapper::getContentOffset(pSVar2,RVA,false);
      bVar4 = SectionHdrWrapper::getContentSize(pSVar2,RVA,false);
      bVar7 = true;
      if (bVar4 < uVar5) {
        (*(pSVar2->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
          super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1d])
                  (pSVar2,1,0xffffffffffffffff,uVar5);
        iVar1 = (*(this->optHdr->super_PEElementWrapper).super_ExeElementWrapper.
                  super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1d])
                          (this->optHdr,0x13,0xffffffffffffffff,oVar3 + uVar5);
        if ((char)iVar1 == '\0') {
          Logger::append(D_ERROR,"Can not change OptHdr!");
        }
      }
    }
  }
  WatchedLocker::~WatchedLocker(&WStack_68);
  if (bVar7) {
    (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer._vptr_AbstractByteBuffer[10]
    )(this,lVar6);
    pSVar2 = getLastSection(this);
  }
  else {
    pSVar2 = (SectionHdrWrapper *)0x0;
  }
  return pSVar2;
}

Assistant:

SectionHdrWrapper* PEFile::extendLastSection(bufsize_t addedSize)
{
    bufsize_t newSize = 0;
    
    { //scope0
        WatchedLocker lock(&m_peMutex, PE_SHOW_LOCK, __FUNCTION__);
        SectionHdrWrapper* secHdr = _getLastSection();
        if (!secHdr) return nullptr;

        //TODO: check overlay...
        const bufsize_t fullSize = getContentSize();
        newSize = fullSize + addedSize;

        const offset_t secROffset = secHdr->getContentOffset(Executable::RAW, false);
        if (secROffset == INVALID_ADDR) {
            return NULL;
        }
        const bufsize_t secNewRSize = newSize - secROffset; //include overlay in section
        secHdr->setNumValue(SectionHdrWrapper::RSIZE, uint64_t(secNewRSize));
        
        const offset_t secVOffset = secHdr->getContentOffset(Executable::RVA, false);
        const bufsize_t secVSize = secHdr->getContentSize(Executable::RVA, false);

        // if the previous virtual size is smaller than the new raw size, then update it:
        if (secVSize < secNewRSize) {
            secHdr->setNumValue(SectionHdrWrapper::VSIZE, uint64_t(secNewRSize));

            // if the virtual size of section has changed,
            // update the Size of Image (saved in the header):
            bufsize_t newVSize = secVOffset + secNewRSize;
            this->setVirtualSize(newVSize);
        }

    } //!scope0
    
    //update raw size:
    this->resize(newSize);
    //finally, retrieve the resized section:
    return getLastSection();
}